

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall doctest::Context::Context(Context *this,int argc,char **argv)

{
  String *pSVar1;
  char *pcVar2;
  vector<doctest::String,_std::allocator<doctest::String>_> *__cur;
  ContextState *pCVar3;
  long lVar4;
  pointer __s;
  _Rb_tree_header *p_Var5;
  size_t sVar6;
  char *__dest;
  anon_union_24_2_13149d16_for_String_2 local_48;
  
  pCVar3 = (ContextState *)operator_new(0x1160);
  (pCVar3->super_ContextOptions).cout = (ostream *)0x0;
  (pCVar3->super_ContextOptions).binary_name.field_0.buf[0] = '\0';
  (pCVar3->super_ContextOptions).binary_name.field_0.buf[0x17] = '\x17';
  (pCVar3->super_ContextOptions).currentTest = (TestCase *)0x0;
  (pCVar3->super_ContextOptions).out.field_0.buf[0] = '\0';
  *(undefined2 *)((long)&(pCVar3->super_ContextOptions).out.field_0 + 0x17) = 0x17;
  (pCVar3->super_ContextOptions).order_by.field_0.buf[0x17] = '\x17';
  lVar4 = 0xb8;
  do {
    *(undefined4 *)((long)&(pCVar3->super_ContextOptions).cout + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x8b8);
  lVar4 = 0x8b8;
  do {
    *(undefined4 *)((long)&(pCVar3->super_ContextOptions).cout + lVar4) = 0;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x10b8);
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0xd8);
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = __s;
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __s + 9;
  memset(__s,0,0xd8);
  (pCVar3->filters).
  super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = __s + 9;
  p_Var5 = &(pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header;
  (pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pCVar3->reporters_currently_used).
  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->reporters_currently_used).
  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar3->reporters_currently_used).
  super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar3->ah = (assert_handler)0x0;
  (pCVar3->timer).m_ticks = 0;
  (pCVar3->stringifiedContexts).
  super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->stringifiedContexts).
  super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar3->stringifiedContexts).
  super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar3->subcasesStack).
  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar3->subcasesStack).
  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar3->subcasesStack).
  super__Vector_base<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header
  ;
  (pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var5->_M_header;
  (pCVar3->subcasesPassed)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pCVar3->shouldLogCurrentException)._M_base._M_i = false;
  this->p = pCVar3;
  parseArgs(this,argc,argv,true);
  if (argc != 0) {
    pcVar2 = *argv;
    sVar6 = strlen(pcVar2);
    __dest = String::allocate((String *)&local_48.data,(uint)sVar6);
    memcpy(__dest,pcVar2,sVar6 & 0xffffffff);
    pCVar3 = this->p;
    pSVar1 = &(pCVar3->super_ContextOptions).binary_name;
    if (&pSVar1->field_0 == &local_48) {
      if ((local_48.buf[0x17] < '\0') && (local_48.data.ptr != (char *)0x0)) {
        operator_delete__(local_48.data.ptr);
      }
    }
    else {
      if (((pCVar3->super_ContextOptions).binary_name.field_0.buf[0x17] < '\0') &&
         (pcVar2 = (pSVar1->field_0).data.ptr, pcVar2 != (char *)0x0)) {
        operator_delete__(pcVar2);
      }
      *(ulong *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 0x10) =
           CONCAT17(local_48.buf[0x17],local_48._16_7_);
      (pSVar1->field_0).data.ptr = local_48.data.ptr;
      *(undefined8 *)((long)&(pCVar3->super_ContextOptions).binary_name.field_0 + 8) =
           local_48._8_8_;
    }
  }
  return;
}

Assistant:

Context::Context(int argc, const char* const* argv)
        : p(new detail::ContextState) {
    parseArgs(argc, argv, true);
    if(argc)
        p->binary_name = argv[0];
}